

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeFinalizing.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_35::TypeFinalizing::run(TypeFinalizing *this,Module *module)

{
  bool *__u;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar1;
  undefined1 auVar2 [8];
  undefined1 local_130 [8];
  optional<wasm::SubTypes> subTypes;
  HeapType type;
  _Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_68;
  undefined1 local_50 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> privateTypes;
  
  if (((module->features).features & 0x400) != 0) {
    subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
    super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
    super__Optional_payload_base<wasm::SubTypes>._M_payload._72_1_ = 0;
    if (this->finalize == true) {
      SubTypes::SubTypes((SubTypes *)
                         &subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
                          super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
                          super__Optional_payload_base<wasm::SubTypes>._M_engaged,module);
      __u = &subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
             super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
             super__Optional_payload_base<wasm::SubTypes>._M_engaged;
      std::optional<wasm::SubTypes>::operator=
                ((optional<wasm::SubTypes> *)local_130,(SubTypes *)__u);
      SubTypes::~SubTypes((SubTypes *)__u);
    }
    privateTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)module;
    wasm::ModuleUtils::getPrivateHeapTypes
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_50,module);
    for (auVar2 = local_50;
        auVar2 != (undefined1  [8])
                  privateTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        auVar2 = (undefined1  [8])((long)auVar2 + 8)) {
      subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
      super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
      super__Optional_payload_base<wasm::SubTypes>._80_8_ = ((pointer)auVar2)->id;
      if (this->finalize == true) {
        pvVar1 = SubTypes::getImmediateSubTypes
                           ((SubTypes *)local_130,
                            (HeapType)
                            subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
                            super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
                            super__Optional_payload_base<wasm::SubTypes>._80_8_);
        if ((pvVar1->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
            super__Vector_impl_data._M_start ==
            (pvVar1->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
            super__Vector_impl_data._M_finish) goto LAB_00bf1d82;
      }
      else {
LAB_00bf1d82:
        std::__detail::
        _Insert_base<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)&this->modifiableTypes,
                 (value_type *)
                 &subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
                  super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
                  super__Optional_payload_base<wasm::SubTypes>._M_engaged);
      }
    }
    GlobalTypeRewriter::GlobalTypeRewriter
              ((GlobalTypeRewriter *)
               &subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
                super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
                super__Optional_payload_base<wasm::SubTypes>._M_engaged,
               (Module *)
               privateTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
    subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
    super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
    super__Optional_payload_base<wasm::SubTypes>._80_8_ = &PTR__GlobalTypeRewriter_011263b8;
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GlobalTypeRewriter::update
              ((GlobalTypeRewriter *)
               &subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
                super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
                super__Optional_payload_base<wasm::SubTypes>._M_engaged,
               (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&local_68);
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base(&local_68);
    GlobalTypeRewriter::~GlobalTypeRewriter
              ((GlobalTypeRewriter *)
               &subTypes.super__Optional_base<wasm::SubTypes,_false,_false>._M_payload.
                super__Optional_payload<wasm::SubTypes,_true,_false,_false>.
                super__Optional_payload_base<wasm::SubTypes>._M_engaged);
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_50);
    std::_Optional_payload_base<wasm::SubTypes>::_M_reset
              ((_Optional_payload_base<wasm::SubTypes> *)local_130);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    // To make a type final, it must have no subtypes.
    std::optional<SubTypes> subTypes;
    if (finalize) {
      subTypes = SubTypes(*module);
    }

    auto privateTypes = ModuleUtils::getPrivateHeapTypes(*module);
    for (auto type : privateTypes) {
      // If we are finalizing types then we can only do that to leaf types. If
      // we are unfinalizing, we can do that unconditionally.
      if (!finalize || subTypes->getImmediateSubTypes(type).empty()) {
        modifiableTypes.insert(type);
      }
    }

    class TypeRewriter : public GlobalTypeRewriter {
      TypeFinalizing& parent;

    public:
      TypeRewriter(Module& wasm, TypeFinalizing& parent)
        : GlobalTypeRewriter(wasm), parent(parent) {}

      void modifyTypeBuilderEntry(TypeBuilder& typeBuilder,
                                  Index i,
                                  HeapType oldType) override {
        if (parent.modifiableTypes.count(oldType)) {
          typeBuilder[i].setOpen(!parent.finalize);
        }
      }
    };

    TypeRewriter(*module, *this).update();
  }